

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

CBlock * CreateGenesisBlock(char *pszTimestamp,CScript *genesisOutputScript,uint32_t nTime,
                           uint32_t nNonce,uint32_t nBits,int32_t nVersion,CAmount *genesisReward)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  CBlock *block;
  CScript *pCVar1;
  size_t sVar2;
  __extent_storage<18446744073709551615UL> __last;
  reference pvVar3;
  uint32_t in_ECX;
  allocator_type *in_RSI;
  CBlock *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  long in_FS_OFFSET;
  int32_t in_stack_00000008;
  undefined8 *in_stack_00000010;
  CBlock *genesis;
  CMutableTransaction txNew;
  CMutableTransaction *in_stack_fffffffffffffe78;
  CScript *in_stack_fffffffffffffe80;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *txIn;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffe88;
  size_type in_stack_fffffffffffffe90;
  CScript *in_stack_fffffffffffffe98;
  CBlock *this;
  CScript *in_stack_fffffffffffffea0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool *mutated;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b9;
  undefined8 local_90;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  bool local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffffe78);
  local_50 = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90);
  local_28[0x10] = false;
  local_28[0x11] = false;
  local_28[0x12] = false;
  local_28[0x13] = false;
  local_28[0x14] = false;
  local_28[0x15] = false;
  local_28[0x16] = false;
  local_28[0x17] = false;
  local_28[0x18] = false;
  local_28[0x19] = false;
  local_28[0x1a] = false;
  local_28[0x1b] = false;
  local_28[0x1c] = false;
  local_28[0x1d] = false;
  local_28[0x1e] = false;
  local_28[0x1f] = false;
  local_28[0] = false;
  local_28[1] = false;
  local_28[2] = false;
  local_28[3] = false;
  local_28[4] = false;
  local_28[5] = false;
  local_28[6] = false;
  local_28[7] = false;
  local_28[8] = false;
  local_28[9] = false;
  local_28[10] = false;
  local_28[0xb] = false;
  local_28[0xc] = false;
  local_28[0xd] = false;
  local_28[0xe] = false;
  local_28[0xf] = false;
  mutated = local_28;
  CScript::CScript((CScript *)in_stack_fffffffffffffe78);
  block = (CBlock *)
          CScript::operator<<((CScript *)in_stack_fffffffffffffe88,
                              (int64_t)in_stack_fffffffffffffe80);
  local_90 = 4;
  CScriptNum::CScriptNum((CScriptNum *)in_stack_fffffffffffffe78,(int64_t *)0x65cc11);
  pCVar1 = CScript::operator<<(in_stack_fffffffffffffea0,(CScriptNum *)in_stack_fffffffffffffe98);
  sVar2 = strlen((char *)in_RSI);
  __last._M_extent_value = (size_t)(in_RSI + sVar2);
  this_00 = &local_b9;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe78);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (this_00,(uchar *)pCVar1,(uchar *)__last._M_extent_value,in_RSI);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffe88,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe80);
  b._M_extent._M_extent_value = __last._M_extent_value;
  b._M_ptr = (pointer)in_RSI;
  CScript::operator<<(in_stack_fffffffffffffe98,b);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe88,
             (size_type)in_stack_fffffffffffffe80);
  CScript::operator=((CScript *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffe78);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe78);
  pCVar1 = (CScript *)*in_stack_00000010;
  this = (CBlock *)0x0;
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)pCVar1,
                      (size_type)in_stack_fffffffffffffe80);
  pvVar3->nValue = (CAmount)pCVar1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)pCVar1,(size_type)in_stack_fffffffffffffe80)
  ;
  CScript::operator=(pCVar1,in_stack_fffffffffffffe80);
  CBlock::CBlock(this);
  (in_RDI->super_CBlockHeader).nTime = in_ECX;
  (in_RDI->super_CBlockHeader).nBits = in_R9D;
  (in_RDI->super_CBlockHeader).nNonce = in_R8D;
  (in_RDI->super_CBlockHeader).nVersion = in_stack_00000008;
  txIn = &in_RDI->vtx;
  MakeTransactionRef<CMutableTransaction>((CMutableTransaction *)txIn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffffe78,(value_type *)0x65cdd3);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe78);
  base_blob<256U>::SetNull((base_blob<256U> *)txIn);
  BlockMerkleRoot(block,mutated);
  *(undefined8 *)(in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
       local_48;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       local_40;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_38;
  *(undefined8 *)
   ((in_RDI->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_30;
  CMutableTransaction::~CMutableTransaction(in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static CBlock CreateGenesisBlock(const char* pszTimestamp, const CScript& genesisOutputScript, uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    CMutableTransaction txNew;
    txNew.version = 1;
    txNew.vin.resize(1);
    txNew.vout.resize(1);
    txNew.vin[0].scriptSig = CScript() << 486604799 << CScriptNum(4) << std::vector<unsigned char>((const unsigned char*)pszTimestamp, (const unsigned char*)pszTimestamp + strlen(pszTimestamp));
    txNew.vout[0].nValue = genesisReward;
    txNew.vout[0].scriptPubKey = genesisOutputScript;

    CBlock genesis;
    genesis.nTime    = nTime;
    genesis.nBits    = nBits;
    genesis.nNonce   = nNonce;
    genesis.nVersion = nVersion;
    genesis.vtx.push_back(MakeTransactionRef(std::move(txNew)));
    genesis.hashPrevBlock.SetNull();
    genesis.hashMerkleRoot = BlockMerkleRoot(genesis);
    return genesis;
}